

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O0

ButtonRole __thiscall
QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
::take(QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
       *this,QAbstractButton **key)

{
  ButtonRole BVar1;
  QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
  *unaff_retaddr;
  QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
  *in_stack_00000008;
  undefined1 in_stack_00000030 [16];
  
  find(in_stack_00000008,(QAbstractButton **)unaff_retaddr);
  BVar1 = do_take(unaff_retaddr,(iterator)in_stack_00000030);
  return BVar1;
}

Assistant:

T take(const Key &key)
    {
        return do_take(find(key));
    }